

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<double_const&>::captureExpression<(Catch::Internal::Operator)0,double>
          (ExpressionLhs<double_const&> *this,double *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  char *__s;
  Catch *this_00;
  string *__return_storage_ptr__;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_38;
  double *local_18;
  double *rhs_local;
  ExpressionLhs<const_double_&> *this_local;
  
  pRVar1 = *(ResultBuilder **)this;
  local_18 = rhs;
  rhs_local = (double *)this;
  result = Internal::compare<(Catch::Internal::Operator)0,double,double>(*(double **)(this + 8),rhs)
  ;
  this_00 = (Catch *)(ulong)result;
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  __return_storage_ptr__ = &local_38;
  Catch::toString_abi_cxx11_(__return_storage_ptr__,this_00,**(double **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,__return_storage_ptr__);
  Catch::toString_abi_cxx11_(&local_68,(Catch *)__return_storage_ptr__,*local_18);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  __s = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }